

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsDemuxer.cpp
# Opt level: O2

int __thiscall
TSDemuxer::simpleDemuxBlock
          (TSDemuxer *this,DemuxedData *demuxedData,PIDSet *acceptedPIDs,int64_t *discardSize)

{
  size_t num;
  AdaptiveField *this_00;
  pointer puVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  _Rb_tree_node_base *p_Var6;
  _Base_ptr p_Var7;
  undefined4 extraout_var;
  ulong uVar8;
  iterator iVar9;
  iterator iVar10;
  long lVar11;
  long lVar12;
  iterator iVar13;
  mapped_type *pmVar14;
  int64_t iVar15;
  mapped_type *this_01;
  undefined4 *puVar16;
  undefined1 *puVar17;
  size_t sVar18;
  uint8_t *puVar19;
  pointer puVar20;
  PIDSet *__range2;
  byte bVar21;
  AdaptiveField *pAVar22;
  long lVar23;
  bool isFirstBlock;
  PESPacket *local_1278;
  uint32_t readedBytes;
  undefined1 *local_1268;
  MemoryBlock *local_1260;
  AdaptiveField *local_1258;
  AdaptiveField *local_1250;
  int pid;
  int64_t local_1240;
  TS_program_map_section *local_1238;
  map<int,_long,_std::less<int>,_std::allocator<std::pair<const_int,_long>_>_> *local_1230;
  int readRez;
  _Base_ptr local_1220;
  _Base_ptr local_1218;
  PIDListMap *local_1210;
  undefined1 *local_1208;
  undefined8 local_1200;
  undefined1 local_11f8;
  undefined7 uStack_11f7;
  undefined8 uStack_11f0;
  TS_program_association_section pat;
  int acceptedPID;
  uint8_t pmtBuffer [4096];
  
  if (this->m_firstDemuxCall == true) {
    for (p_Var6 = (acceptedPIDs->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var6 != &(acceptedPIDs->_M_t)._M_impl.super__Rb_tree_header;
        p_Var6 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var6)) {
      this->m_acceptedPidCache[(int)p_Var6[1]._M_color] = '\x01';
    }
    this->m_firstDemuxCall = false;
  }
  memset(pmtBuffer,0,0x1000);
  for (p_Var7 = (acceptedPIDs->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var7 != &(acceptedPIDs->_M_t)._M_impl.super__Rb_tree_header;
      p_Var7 = (_Base_ptr)std::_Rb_tree_increment(p_Var7)) {
    acceptedPID = p_Var7[1]._M_color;
    std::map<int,_MemoryBlock,_std::less<int>,_std::allocator<std::pair<const_int,_MemoryBlock>_>_>
    ::operator[](demuxedData,&acceptedPID);
  }
  *discardSize = 0;
  readRez = 0;
  iVar3 = (*this->m_bufferedReader->_vptr_AbstractReader[2])
                    (this->m_bufferedReader,(ulong)(uint)this->m_readerID,&readedBytes,&readRez);
  if (readRez == 2) {
    this->m_lastReadRez = 2;
    iVar3 = 2;
  }
  else {
    sVar18 = this->m_tmpBufferLen;
    if ((sVar18 + readedBytes == 0) || ((readedBytes == 0 && (this->m_lastReadRez == 1)))) {
      this->m_lastReadRez = readRez;
      iVar3 = 1;
    }
    else {
      if (readedBytes != 0) {
        (*this->m_bufferedReader->_vptr_AbstractReader[5])
                  (this->m_bufferedReader,(ulong)(uint)this->m_readerID,(ulong)readedBytes);
        sVar18 = this->m_tmpBufferLen;
      }
      this->m_lastReadRez = readRez;
      pAVar22 = (AdaptiveField *)(CONCAT44(extraout_var,iVar3) + 0xbc);
      if (0 < (long)sVar18) {
        memcpy((void *)((long)pAVar22 - sVar18),this->m_tmpBuffer,sVar18);
        readedBytes = readedBytes + (int)this->m_tmpBufferLen;
        pAVar22 = (AdaptiveField *)((long)pAVar22 - this->m_tmpBufferLen);
        this->m_tmpBufferLen = 0;
      }
      *discardSize = 0;
      uVar8 = (ulong)readedBytes;
      if (uVar8 < 0xbc) {
        *discardSize = uVar8;
        iVar3 = 0;
      }
      else {
        local_1258 = (AdaptiveField *)(&pAVar22[-0x2f].field_0x0 + uVar8);
        if ((this->m_firstCall == true) && (this->m_m2tsMode == false)) {
          bVar2 = checkForRealM2ts(this,(uint8_t *)pAVar22,(uint8_t *)local_1258);
          this->m_m2tsMode = bVar2;
          this->m_firstCall = false;
        }
        bVar21 = this->m_m2tsHdrDiscarded;
        local_1250 = pAVar22;
        if (((this->m_pmt).pidList._M_t._M_impl.super__Rb_tree_header._M_node_count == 0) ||
           (bVar2 = mvcContinueExpected(this), bVar2)) {
          local_1238 = &this->m_pmt;
          TS_program_association_section::TS_program_association_section(&pat);
          iVar3 = 0;
          pAVar22 = local_1250;
          while (this->m_curPos = (uint8_t *)pAVar22, pAVar22 <= local_1258) {
            if ((bVar21 & 1) != 0) goto LAB_001db648;
            if (this->m_m2tsMode != true) goto LAB_001db648;
            pAVar22 = pAVar22 + 1;
            while( true ) {
              this->m_curPos = (uint8_t *)pAVar22;
LAB_001db648:
              if ((*(char *)pAVar22 == 'G') || (local_1258 < pAVar22)) break;
              pAVar22 = (AdaptiveField *)&pAVar22->field_0x1;
            }
            if (local_1258 < pAVar22) break;
            pid = (uint)*pAVar22 >> 0x10 & 0xff | (uint)*pAVar22 & 0x1f00;
            iVar4 = TSPacket::getHeaderSize((TSPacket *)pAVar22);
            if (0xbc < iVar4) {
              std::__cxx11::ostringstream::ostringstream((ostringstream *)&acceptedPID);
              std::operator<<((ostream *)&acceptedPID,"Invalid tsPacket->getHeaderSize");
              puVar16 = (undefined4 *)__cxa_allocate_exception(0x28);
              std::__cxx11::stringbuf::str();
              *puVar16 = 3;
              *(undefined4 **)(puVar16 + 2) = puVar16 + 6;
              if (local_1208 == &local_11f8) {
                *(ulong *)(puVar16 + 6) = CONCAT71(uStack_11f7,local_11f8);
                *(undefined8 *)(puVar16 + 8) = uStack_11f0;
              }
              else {
                *(undefined1 **)(puVar16 + 2) = local_1208;
                *(ulong *)(puVar16 + 6) = CONCAT71(uStack_11f7,local_11f8);
              }
              *(undefined8 *)(puVar16 + 4) = local_1200;
              local_1200 = 0;
              local_11f8 = 0;
              local_1208 = &local_11f8;
              __cxa_throw(puVar16,&VodCoreException::typeinfo,VodCoreException::~VodCoreException);
            }
            if (pid == 0) {
              puVar19 = this->m_curPos;
              iVar4 = TSPacket::getHeaderSize((TSPacket *)pAVar22);
              iVar5 = TSPacket::getHeaderSize((TSPacket *)pAVar22);
              TS_program_association_section::deserialize(&pat,puVar19 + iVar4,0xbc - iVar5);
            }
            else {
              iVar9 = std::
                      _Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                      ::find(&pat.pmtPids._M_t,&pid);
              if (((_Rb_tree_header *)iVar9._M_node !=
                   &pat.pmtPids._M_t._M_impl.super__Rb_tree_header) &&
                 (((pAVar22->field_0x1 & 0x40) != 0 || (0 < iVar3)))) {
                iVar4 = TSPacket::getHeaderSize((TSPacket *)pAVar22);
                if (0x1000 < (iVar3 - iVar4) + 0xbc) break;
                local_1260 = (MemoryBlock *)(pmtBuffer + iVar3);
                puVar19 = this->m_curPos;
                iVar4 = TSPacket::getHeaderSize((TSPacket *)pAVar22);
                iVar5 = TSPacket::getHeaderSize((TSPacket *)pAVar22);
                memcpy(local_1260,puVar19 + iVar4,(long)(0xbc - iVar5));
                iVar4 = TSPacket::getHeaderSize((TSPacket *)pAVar22);
                iVar3 = (iVar3 - iVar4) + 0xbc;
                bVar2 = TS_program_map_section::isFullBuff(pmtBuffer,iVar3);
                if (bVar2) {
                  TS_program_map_section::deserialize(local_1238,pmtBuffer,iVar3);
                  iVar3 = 0;
                  if ((this->m_pmt).video_type != 0x20) {
                    this->m_nonMVCVideoFound = true;
                  }
                }
              }
            }
            bVar21 = 0;
            pAVar22 = (AdaptiveField *)(this->m_curPos + 0xbc);
          }
          std::
          _Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
          ::~_Rb_tree(&pat.pmtPids._M_t);
        }
        local_1210 = &(this->m_pmt).pidList;
        local_1220 = &(this->m_pmt).pidList._M_t._M_impl.super__Rb_tree_header._M_header;
        local_1230 = &this->m_firstPtsTime;
        local_1218 = &(this->m_firstPtsTime)._M_t._M_impl.super__Rb_tree_header._M_header;
        local_1238 = (TS_program_map_section *)CONCAT44(local_1238._4_4_,0xffffffff);
        local_1260 = (MemoryBlock *)0x0;
        pAVar22 = local_1250;
        while (this->m_curPos = (uint8_t *)pAVar22, pAVar22 <= local_1258) {
          if ((this->m_m2tsHdrDiscarded == false) && (this->m_m2tsMode == true)) {
            *discardSize = *discardSize + 4;
            pAVar22 = pAVar22 + 1;
            this->m_curPos = (uint8_t *)pAVar22;
          }
          lVar11 = *discardSize;
          lVar23 = 0;
          while( true ) {
            this_00 = (AdaptiveField *)(&pAVar22->field_0x0 + lVar23);
            if (local_1258 < this_00) {
              this->m_m2tsHdrDiscarded = true;
              pAVar22 = this_00;
              goto LAB_001dbbf0;
            }
            if (*(char *)this_00 == 'G') break;
            *discardSize = lVar11 + lVar23 + 1;
            this->m_curPos = &pAVar22->field_0x1 + lVar23;
            lVar23 = lVar23 + 1;
          }
          this->m_m2tsHdrDiscarded = false;
          acceptedPID = *(uint *)(&pAVar22->field_0x0 + lVar23) >> 0x10 & 0xff |
                        *(uint *)(&pAVar22->field_0x0 + lVar23) & 0x1f00;
          *discardSize = lVar11 + lVar23 + 0xbc;
          iVar3 = TSPacket::getHeaderSize((TSPacket *)this_00);
          local_1278 = (PESPacket *)(&this_00->field_0x0 + iVar3);
          if (((((&this_00->field_0x0)[iVar3] == '\0') &&
               (puVar17 = &pAVar22->field_0x0 + iVar3, puVar17[lVar23 + 1] == '\0')) &&
              (puVar17[lVar23 + 2] == '\x01')) && (((&pAVar22->field_0x1)[lVar23] & 0x40) != 0)) {
            local_1268 = puVar17;
            iVar10 = std::
                     _Rb_tree<int,_std::pair<const_int,_PMTStreamInfo>,_std::_Select1st<std::pair<const_int,_PMTStreamInfo>_>,_std::less<int>,_std::allocator<std::pair<const_int,_PMTStreamInfo>_>_>
                     ::find(&local_1210->_M_t,&acceptedPID);
            bVar21 = local_1268[lVar23 + 7];
            if ((char)bVar21 < '\0') {
              lVar11 = get_pts(local_1268 + lVar23 + 9);
              local_1240 = lVar11;
              if (0xbf < bVar21) {
                lVar11 = get_pts(local_1268 + lVar23 + 0xe);
              }
              if (this->m_lastPTS < local_1240) {
                this->m_lastPTS = local_1240;
              }
              if ((this->m_firstPTS == -1) || (local_1240 < this->m_firstPTS)) {
                this->m_firstPTS = local_1240;
              }
              if ((iVar10._M_node != local_1220) &&
                 (bVar2 = isVideoPID(*(StreamType *)&iVar10._M_node[1]._M_parent), bVar2)) {
                if ((this->m_firstVideoPTS == -1) || (local_1240 < this->m_firstVideoPTS)) {
                  this->m_firstVideoPTS = local_1240;
                }
                if (this->m_lastVideoPTS < local_1240) {
                  this->m_lastVideoPTS = local_1240;
                }
                lVar12 = this->m_lastVideoDTS;
                if (this->m_lastVideoDTS == -1) {
                  this->m_lastVideoDTS = lVar11;
                  lVar12 = lVar11;
                }
                if ((this->m_videoDtsGap == -1) && (lVar11 - lVar12 != 0 && lVar12 <= lVar11)) {
                  this->m_videoDtsGap = lVar11 - lVar12;
                }
              }
              iVar15 = local_1240;
              iVar13 = std::
                       _Rb_tree<int,_std::pair<const_int,_long>,_std::_Select1st<std::pair<const_int,_long>_>,_std::less<int>,_std::allocator<std::pair<const_int,_long>_>_>
                       ::find(&local_1230->_M_t,&acceptedPID);
              if ((iVar13._M_node == local_1218) ||
                 ((this->m_curFileNum == 0 &&
                  (pmVar14 = std::
                             map<int,_long,_std::less<int>,_std::allocator<std::pair<const_int,_long>_>_>
                             ::operator[](local_1230,&acceptedPID), iVar15 < *pmVar14)))) {
                pmVar14 = std::
                          map<int,_long,_std::less<int>,_std::allocator<std::pair<const_int,_long>_>_>
                          ::operator[](local_1230,&acceptedPID);
                *pmVar14 = iVar15;
              }
            }
            if ((iVar10._M_node == local_1220) || (*(int *)&iVar10._M_node[1]._M_parent == 0x90)) {
              lVar11 = this->m_firstVideoPTS;
              if (lVar11 == -1) {
                lVar11 = this->m_firstPTS;
              }
              if ((byte)local_1268[lVar23 + 7] < 0xc0) {
                if ((char)local_1268[lVar23 + 7] < '\0') {
                  iVar15 = get_pts(local_1268 + lVar23 + 9);
                  PESPacket::setPts(local_1278,(iVar15 - lVar11) + this->m_prevFileLen);
                }
              }
              else {
                iVar15 = get_pts(local_1268 + lVar23 + 9);
                lVar12 = this->m_prevFileLen;
                local_1240 = (iVar15 - lVar11) + lVar12;
                iVar15 = get_pts(local_1268 + lVar23 + 0xe);
                PESPacket::setPtsAndDts(local_1278,local_1240,(lVar12 - lVar11) + iVar15);
              }
            }
            else {
              local_1278 = (PESPacket *)
                           (local_1268 + (ulong)(byte)(local_1268[lVar23 + 8] + 9) + lVar23);
            }
          }
          puVar19 = this->m_curPos;
          if (this->m_acceptedPidCache[acceptedPID] != '\0') {
            num = ((long)puVar19 - (long)local_1278) + 0xbc;
            if (0 < (long)num) {
              if (acceptedPID == (int)local_1238) {
                this_01 = local_1260;
                if (local_1260 == (MemoryBlock *)0x0) {
                  local_1260 = (MemoryBlock *)0x0;
                  goto LAB_001dbbc7;
                }
              }
              else {
                this_01 = std::
                          map<int,_MemoryBlock,_std::less<int>,_std::allocator<std::pair<const_int,_MemoryBlock>_>_>
                          ::operator[](demuxedData,&acceptedPID);
                local_1238 = (TS_program_map_section *)CONCAT44(local_1238._4_4_,acceptedPID);
              }
              MemoryBlock::grow(this_01,num);
              puVar1 = (this_01->m_data).
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                       super__Vector_impl_data._M_start;
              puVar20 = (pointer)0x0;
              if (puVar1 != (this_01->m_data).
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_finish) {
                puVar20 = puVar1;
              }
              local_1260 = this_01;
              memcpy(puVar20 + (this_01->m_size - ((long)puVar19 - (long)local_1278)) + -0xbc,
                     local_1278,num);
              puVar19 = this->m_curPos;
            }
LAB_001dbbc7:
            *discardSize = *discardSize - num;
          }
          pAVar22 = (AdaptiveField *)(puVar19 + 0xbc);
        }
LAB_001dbbf0:
        iVar3 = 0;
        if (pAVar22 < (AdaptiveField *)(&local_1250->field_0x0 + readedBytes)) {
          sVar18 = (long)(&local_1250->field_0x0 + readedBytes) - (long)pAVar22;
          this->m_tmpBufferLen = sVar18;
          memmove(this->m_tmpBuffer,pAVar22,sVar18);
        }
      }
    }
  }
  return iVar3;
}

Assistant:

int TSDemuxer::simpleDemuxBlock(DemuxedData& demuxedData, const PIDSet& acceptedPIDs, int64_t& discardSize)
{
    if (m_firstDemuxCall)
    {
        for (const int acceptedPID : acceptedPIDs) m_acceptedPidCache[acceptedPID] = 1;
        m_firstDemuxCall = false;
    }

    uint8_t pmtBuffer[4096]{0};
    int pmtBufferLen = 0;
    MemoryBlock* vect = nullptr;
    int lastPid = -1;

    for (int acceptedPID : acceptedPIDs) demuxedData[acceptedPID];

    discardSize = 0;
    uint32_t readedBytes;
    int readRez = 0;
    bool isFirstBlock = false;
    uint8_t* data = m_bufferedReader->readBlock(m_readerID, readedBytes, readRez, &isFirstBlock);  // blocked read mode
    if (readRez == BufferedFileReader::DATA_NOT_READY)
    {
        m_lastReadRez = readRez;
        return BufferedFileReader::DATA_NOT_READY;
    }
    if (readedBytes + m_tmpBufferLen == 0 || (readedBytes == 0 && m_lastReadRez == BufferedReader::DATA_EOF))
    {
        m_lastReadRez = readRez;
        return BufferedReader::DATA_EOF;
    }
    if (readedBytes > 0)
        m_bufferedReader->notify(m_readerID, readedBytes);
    m_lastReadRez = readRez;
    data += TS_FRAME_SIZE;
    if (m_tmpBufferLen > 0)
    {
        memcpy(data - m_tmpBufferLen, m_tmpBuffer, m_tmpBufferLen);
        data -= m_tmpBufferLen;
        readedBytes += static_cast<uint32_t>(m_tmpBufferLen);
        m_tmpBufferLen = 0;
    }

    if (isFirstBlock)
    {
        if (m_curFileNum < m_mplsInfo.size())
            m_prevFileLen +=
                static_cast<int64_t>(m_mplsInfo[m_curFileNum].OUT_time - m_mplsInfo[m_curFileNum].IN_time) *
                2;  // in 90Khz clock
        else
        {
            if (m_firstVideoPTS != -1 && m_lastVideoPTS != -1)
                m_prevFileLen += (m_lastVideoPTS - m_firstVideoPTS + m_videoDtsGap);
            else  // no video file
                m_prevFileLen += (m_lastPTS - m_firstPTS);
        }
        m_firstPTS = -1;
        m_lastPTS = -1;
        m_firstVideoPTS = -1;
        m_lastVideoPTS = -1;
        m_curFileNum++;
    }

    discardSize = 0;

    if (readedBytes < TS_FRAME_SIZE)
    {
        discardSize += readedBytes;
        return 0;
    }

    const uint8_t* lastFrameAddr = data + readedBytes - TS_FRAME_SIZE;

    if (m_firstCall && !m_m2tsMode)
    {
        m_m2tsMode = checkForRealM2ts(data, lastFrameAddr);
        m_firstCall = false;
    }

    bool forpmtm2tsHdrDiscarded = m_m2tsHdrDiscarded;
    if (m_pmt.pidList.empty() || mvcContinueExpected())
    {
        TS_program_association_section pat;
        for (m_curPos = data; m_curPos <= lastFrameAddr; m_curPos += TS_FRAME_SIZE)
        {
            if (!forpmtm2tsHdrDiscarded && m_m2tsMode)
                m_curPos += 4;
            while (*m_curPos != 0x47 && m_curPos <= lastFrameAddr) m_curPos++;
            if (m_curPos > lastFrameAddr)
                break;
            forpmtm2tsHdrDiscarded = false;

            const auto tsPacket = reinterpret_cast<TSPacket*>(m_curPos);
            int pid = tsPacket->getPID();
            if (TS_FRAME_SIZE < tsPacket->getHeaderSize())
            {
                THROW(ERR_COMMON, "Invalid tsPacket->getHeaderSize")
                break;
            }
            if (pid == 0)
            {  // PAT
                pat.deserialize(m_curPos + tsPacket->getHeaderSize(), TS_FRAME_SIZE - tsPacket->getHeaderSize());
            }
            else if (pat.pmtPids.find(pid) != pat.pmtPids.end())
            {  // PMT
                if (tsPacket->payloadStart || pmtBufferLen > 0)
                {
                    if (pmtBufferLen + TS_FRAME_SIZE - tsPacket->getHeaderSize() > 4096)
                        break;
                    memcpy(pmtBuffer + pmtBufferLen, m_curPos + tsPacket->getHeaderSize(),
                           TS_FRAME_SIZE - tsPacket->getHeaderSize());
                    pmtBufferLen += TS_FRAME_SIZE - tsPacket->getHeaderSize();
                    if (TS_program_map_section::isFullBuff(pmtBuffer, pmtBufferLen))
                    {
                        m_pmt.deserialize(pmtBuffer, pmtBufferLen);
                        if (m_pmt.video_type != static_cast<int>(StreamType::VIDEO_MVC))
                            m_nonMVCVideoFound = true;
                        pmtBufferLen = 0;
                    }
                }
            }
        }
    }

    for (m_curPos = data; m_curPos <= lastFrameAddr; m_curPos += TS_FRAME_SIZE)
    {
        if (!m_m2tsHdrDiscarded && m_m2tsMode)
        {
            discardSize += 4;
            m_curPos += 4;
        }
        while (m_curPos <= lastFrameAddr && *m_curPos != 0x47)
        {
            discardSize++;
            m_curPos++;
        }
        if (m_curPos > lastFrameAddr)
        {
            m_m2tsHdrDiscarded = true;
            break;
        }
        m_m2tsHdrDiscarded = false;

        const auto tsPacket = reinterpret_cast<TSPacket*>(m_curPos);
        int pid = tsPacket->getPID();
        discardSize += TS_FRAME_SIZE;

        // pcrFrames++;

        if (tsPacket->afExists)
        {
            if (tsPacket->adaptiveField.pcrExist)
            {
                // if (prevPCR == -1)
                //	prevPCR = tsPacket->adaptiveField.getPCR33();

                // prevPCR = tsPacket->adaptiveField.getPCR33();
                // LTRACE(LT_INFO, 2, "pcr: " << prevPCR - 55729419ll);
                // pcrFrames = 0;
            }
        }

        uint8_t* frameData = m_curPos + tsPacket->getHeaderSize();
        const bool pesStartCode = frameData[0] == 0 && frameData[1] == 0 && frameData[2] == 1 && tsPacket->payloadStart;
        if (pesStartCode)
        {
            const auto pesPacket = reinterpret_cast<PESPacket*>(frameData);
            auto streamInfo = m_pmt.pidList.find(pid);

            if ((pesPacket->flagsLo & 0x80) == 0x80)
            {
                const int64_t curPts = pesPacket->getPts();
                int64_t curDts = curPts;

                if ((pesPacket->flagsLo & 0xc0) == 0xc0)
                    curDts = pesPacket->getDts();

                if (m_lastPTS == -1 || curPts > m_lastPTS)
                    m_lastPTS = curPts;

                if (m_firstPTS == -1 || curPts < m_firstPTS)
                    m_firstPTS = curPts;

                if (streamInfo != m_pmt.pidList.end() && isVideoPID(streamInfo->second.m_streamType))
                {
                    if (m_firstVideoPTS == -1 || curPts < m_firstVideoPTS)
                        m_firstVideoPTS = curPts;
                    if (curPts > m_lastVideoPTS)
                        m_lastVideoPTS = curPts;
                    if (m_lastVideoDTS == -1)
                        m_lastVideoDTS = curDts;
                    if (m_videoDtsGap == -1 && curDts > m_lastVideoDTS)
                        m_videoDtsGap = curDts - m_lastVideoDTS;
                }

                if (m_firstPtsTime.find(pid) == m_firstPtsTime.end() ||
                    (m_curFileNum == 0 && curPts < m_firstPtsTime[pid]))
                    m_firstPtsTime[pid] = curPts;
            }

            if (streamInfo != m_pmt.pidList.end() &&
                streamInfo->second.m_streamType != StreamType::SUB_PGS)  // demux PGS with PES headers
                frameData += pesPacket->getHeaderLength();
            else
            {
                const int64_t ptsBase = m_firstVideoPTS != -1 ? m_firstVideoPTS : m_firstPTS;
                if ((pesPacket->flagsLo & 0xc0) == 0xc0)
                {
                    const int64_t pts = pesPacket->getPts() - ptsBase + m_prevFileLen;
                    const int64_t dts = pesPacket->getDts() - ptsBase + m_prevFileLen;
                    pesPacket->setPtsAndDts(pts, dts);
                }
                else if ((pesPacket->flagsLo & 0x80) == 0x80)
                {
                    const int64_t pts = pesPacket->getPts() - ptsBase + m_prevFileLen;
                    pesPacket->setPts(pts);
                }
            }
        }

        // if (acceptedPIDs.find(pid) == acceptedPIDs.end())
        if (!m_acceptedPidCache[pid])
            continue;

        const int64_t payloadLen = TS_FRAME_SIZE - (frameData - m_curPos);
        if (payloadLen > 0)
        {
            if (pid != lastPid)
            {
                vect = &demuxedData[pid];
                lastPid = pid;
            }
            if (vect != nullptr)
            {
                vect->grow(payloadLen);
                uint8_t* dst = vect->data() + vect->size() - payloadLen;
                memcpy(dst, frameData, payloadLen);
            }
        }
        discardSize -= payloadLen;
    }
    if (m_curPos < data + readedBytes)
    {
        m_tmpBufferLen = data + readedBytes - m_curPos;
        memmove(m_tmpBuffer, m_curPos, m_tmpBufferLen);
    }

    return 0;
}